

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropframe_encode_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::DropFrameEncodeTestLarge_TestNoMisMatch_Test::
~DropFrameEncodeTestLarge_TestNoMisMatch_Test(DropFrameEncodeTestLarge_TestNoMisMatch_Test *this)

{
  *(undefined ***)this = &PTR__EncoderTest_0103d9f8;
  if (*(DropFrameEncodeTestLarge_TestNoMisMatch_Test **)(this + 0x3a8) != this + 0x3b8) {
    operator_delete(*(DropFrameEncodeTestLarge_TestNoMisMatch_Test **)(this + 0x3a8));
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)(this + -0x18));
  operator_delete((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
                   *)(this + -0x18));
  return;
}

Assistant:

TEST_P(DropFrameEncodeTestLarge, TestNoMisMatch) {
  cfg_.rc_end_usage = AOM_CBR;
  cfg_.rc_buf_sz = 1;
  cfg_.g_pass = AOM_RC_ONE_PASS;
  cfg_.rc_dropframe_thresh = 1;
  cfg_.g_threads = threads_;

  ::libaom_test::I420VideoSource video("desktopqvga2.320_240.yuv", 320, 240, 30,
                                       1, 0, 100);

  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}